

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_traversal_sequencer.h
# Opt level: O1

bool __thiscall
draco::
MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
::GenerateSequenceInternal
          (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
           *this)

{
  DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
  *this_00;
  CornerTable *pCVar1;
  pointer pIVar2;
  CornerTable *pCVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  CornerIndex corner_id;
  int iVar7;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  
  this_00 = &this->traverser_;
  pCVar1 = (this->traverser_).
           super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
           .corner_table_;
  std::
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  ::reserve((this->super_PointsSequencer).out_point_ids_,
            (long)(int)((ulong)((long)(pCVar1->vertex_to_attribute_entry_id_map_).
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pCVar1->vertex_to_attribute_entry_id_map_).
                                     super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 2));
  if (this->corner_order_ ==
      (vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       *)0x0) {
    pCVar3 = ((this->traverser_).
              super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
             .corner_table_)->corner_table_;
    iVar7 = (int)((ulong)((long)(pCVar3->corner_to_vertex_map_).vector_.
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pCVar3->corner_to_vertex_map_).vector_.
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 2) / 3);
    bVar10 = 0 < iVar7;
    if (iVar7 < 1) {
      return true;
    }
    iVar8 = 0;
    bVar4 = DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            ::TraverseFromCorner(this_00,(CornerIndex)0x0);
    if (bVar4) {
      corner_id.value_ = 3;
      do {
        if (iVar7 + -1 == iVar8) {
          return true;
        }
        bVar10 = DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                 ::TraverseFromCorner(this_00,corner_id);
        corner_id.value_ = corner_id.value_ + 3;
        iVar8 = iVar8 + 1;
      } while (bVar10);
      bVar10 = iVar8 < iVar7;
    }
  }
  else {
    pIVar2 = (this->corner_order_->
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar10 = (this->corner_order_->
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish != pIVar2;
    if (!bVar10) {
      return true;
    }
    bVar4 = DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            ::TraverseFromCorner(this_00,(CornerIndex)pIVar2->value_);
    if (bVar4) {
      uVar5 = 1;
      do {
        uVar9 = (ulong)uVar5;
        pIVar2 = (this->corner_order_->
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar6 = (long)(this->corner_order_->
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2 >> 2;
        bVar10 = uVar9 < uVar6;
        if (uVar6 <= uVar9) {
          return true;
        }
        bVar4 = DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                ::TraverseFromCorner(this_00,(CornerIndex)pIVar2[uVar9].value_);
        uVar5 = uVar5 + 1;
      } while (bVar4);
    }
  }
  if (!bVar10) {
    return true;
  }
  return false;
}

Assistant:

bool GenerateSequenceInternal() override {
    // Preallocate memory for storing point indices. We expect the number of
    // points to be the same as the number of corner table vertices.
    out_point_ids()->reserve(traverser_.corner_table()->num_vertices());

    traverser_.OnTraversalStart();
    if (corner_order_) {
      for (uint32_t i = 0; i < corner_order_->size(); ++i) {
        if (!ProcessCorner(corner_order_->at(i))) {
          return false;
        }
      }
    } else {
      const int32_t num_faces = traverser_.corner_table()->num_faces();
      for (int i = 0; i < num_faces; ++i) {
        if (!ProcessCorner(CornerIndex(3 * i))) {
          return false;
        }
      }
    }
    traverser_.OnTraversalEnd();
    return true;
  }